

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatasrc-tj.c
# Opt level: O0

boolean fill_mem_input_buffer(j_decompress_ptr cinfo)

{
  long *in_RDI;
  
  *(undefined4 *)(*in_RDI + 0x28) = 0x78;
  (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
  *(JOCTET **)in_RDI[5] = fill_mem_input_buffer::mybuffer;
  *(undefined8 *)(in_RDI[5] + 8) = 2;
  return 1;
}

Assistant:

METHODDEF(boolean)
fill_mem_input_buffer(j_decompress_ptr cinfo)
{
  static const JOCTET mybuffer[4] = {
    (JOCTET)0xFF, (JOCTET)JPEG_EOI, 0, 0
  };

  /* The whole JPEG data is expected to reside in the supplied memory
   * buffer, so any request for more data beyond the given buffer size
   * is treated as an error.
   */
  WARNMS(cinfo, JWRN_JPEG_EOF);

  /* Insert a fake EOI marker */

  cinfo->src->next_input_byte = mybuffer;
  cinfo->src->bytes_in_buffer = 2;

  return TRUE;
}